

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

Token * __thiscall Tokenizer::parseHeaderKey(Token *__return_storage_ptr__,Tokenizer *this,char c)

{
  char c_00;
  bool bVar1;
  _Optional_base<char,_true,_true> _Var2;
  TokenizerException *pTVar3;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  *this_00;
  _Storage<char,_true> c_01;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string res;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_80;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_58;
  
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  std::operator+(&res,&local_100,c);
  std::__cxx11::string::~string((string *)&local_100);
  _Var2._M_payload.super__Optional_payload_base<char> =
       (_Optional_payload<char,_true,_true,_true>)next(this);
  if (((ushort)_Var2._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
    pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"Unexpected EOF when parsing HeaderKey in HeaderBlock",
               (allocator<char> *)&local_e0);
    TokenizerException::TokenizerException
              (pTVar3,&local_100,this->line_number,this->col_number,&this->current_line);
    __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (_Var2._M_payload.super__Optional_payload_base<char>._M_payload == ':') {
    this->col_number = this->col_number + -1;
    this->pos = this->pos + -1;
    this_00 = &local_58;
    std::__detail::__variant::_Variant_storage<false,int,double,std::__cxx11::string,bool,char>::
    _Variant_storage<2ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,double,std::__cxx11::string,bool,char> *)this_00,&res);
  }
  else {
    bVar1 = false;
    do {
      c_01._M_value = _Var2._M_payload.super__Optional_payload_base<char>._M_payload;
      if (bVar1) {
        c_00 = doBackslash(c_01._M_value);
        bVar1 = isValidHeaderKeyChar(c_00);
        if (!bVar1) {
          pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"Invalid char \"\\",&local_101);
          std::operator+(&local_e0,&local_c0,c_01._M_value);
          std::operator+(&local_100,&local_e0,"\" in HeaderKey");
          TokenizerException::TokenizerException
                    (pTVar3,&local_100,this->line_number,this->col_number,&this->current_line);
          __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::push_back((char)&res);
LAB_00107ecc:
        bVar1 = false;
      }
      else {
        bVar1 = isValidHeaderKeyChar(c_01._M_value);
        if (!bVar1) {
          pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"Invalid char \"",&local_101);
          std::operator+(&local_e0,&local_c0,c_01._M_value);
          std::operator+(&local_100,&local_e0,"\" in HeaderKey");
          TokenizerException::TokenizerException
                    (pTVar3,&local_100,this->line_number,this->col_number,&this->current_line);
          __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar1 = true;
        if (c_01._M_value != '\\') {
          std::__cxx11::string::push_back((char)&res);
          goto LAB_00107ecc;
        }
      }
      _Var2._M_payload.super__Optional_payload_base<char> =
           (_Optional_payload<char,_true,_true,_true>)next(this);
      if (((ushort)_Var2._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
        pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"Unexpected EOF when parsing HeaderKey in HeaderBlock",
                   (allocator<char> *)&local_e0);
        TokenizerException::TokenizerException
                  (pTVar3,&local_100,this->line_number,this->col_number,&this->current_line);
        __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
      }
    } while ((bool)(_Var2._M_payload.super__Optional_payload_base<char>._M_payload != ':' | bVar1));
    this->col_number = this->col_number + -1;
    this->pos = this->pos + -1;
    this_00 = &local_80;
    std::__detail::__variant::_Variant_storage<false,int,double,std::__cxx11::string,bool,char>::
    _Variant_storage<2ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,double,std::__cxx11::string,bool,char> *)this_00,&res);
  }
  __return_storage_ptr__->type = HeaderKey;
  std::__detail::__variant::
  _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&__return_storage_ptr__->value,
                    (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)this_00);
  std::__detail::__variant::
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::~_Variant_storage(this_00);
  std::__cxx11::string::~string((string *)&res);
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::parseHeaderKey(char c) {
    string res = string() + c;
    optional<char> _;
    _ = next();
    if (!_.has_value()) {
        throw TokenizerException("Unexpected EOF when parsing HeaderKey in HeaderBlock", line_number, col_number, current_line);
    }
    c = _.value();
    if (c == ':') {
        unnext();
        return Token(HeaderKey, res);
    }
    bool backslash = false;
    do {
        if (backslash) {
            backslash = false;
            char slashed = doBackslash(c);
            if (!isValidHeaderKeyChar(slashed)) {
                throw TokenizerException(string("Invalid char \"\\") + c + "\" in HeaderKey", line_number, col_number,
                                         current_line);
            }
            res += slashed;
        } else {
            if (!isValidHeaderKeyChar(c)) {
                throw TokenizerException(string("Invalid char \"") + c + "\" in HeaderKey", line_number, col_number,
                                         current_line);
            }
            if (c == '\\')
                backslash = true;
            else {
                backslash = false;
                res += c;
            }
        }
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Unexpected EOF when parsing HeaderKey in HeaderBlock", line_number, col_number,
                                     current_line);
        }
        c = _.value();
    } while (c != ':' || backslash);
    unnext();
    return Token(HeaderKey, res);
}